

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O2

void Saig_ManSimulateFrames(Saig_SimObj_t *pAig,int nFrames,int nPref)

{
  uint uVar1;
  int iVar2;
  Saig_SimObj_t *pObj;
  
  iVar2 = 0;
  if (nFrames < 1) {
    nFrames = iVar2;
  }
LAB_00529cf5:
  pObj = pAig;
  if (iVar2 == nFrames) {
    return;
  }
  do {
    switch(pObj->field_0x8) {
    case 0:
      break;
    case 1:
      pObj->pData[0] = 0xffffffff;
      break;
    case 2:
      if (pObj->iFan0 == 0) {
        uVar1 = Aig_ManRandom(0);
        pObj->pData[0] = uVar1;
      }
      else if (iVar2 != 0) goto switchD_00529d1a_caseD_3;
      break;
    case 3:
switchD_00529d1a_caseD_3:
      Saig_ManSimulateOneInput(pAig,pObj);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSwitch.c"
                    ,0xc2,"void Saig_ManSimulateFrames(Saig_SimObj_t *, int, int)");
    case 5:
      pObj->pData[0] =
           (-(pObj->iFan1 & 1U) ^ pAig[pObj->iFan1 >> 1].pData[0]) &
           (-(pObj->iFan0 & 1U) ^ pAig[pObj->iFan0 >> 1].pData[0]);
      break;
    case 7:
      goto switchD_00529d1a_caseD_7;
    }
    if (nPref <= iVar2) {
      uVar1 = (pObj->pData[0] >> 1 & 0x55555555) + (pObj->pData[0] & 0x55555555);
      uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
      uVar1 = (uVar1 >> 4 & 0x7070707) + (uVar1 & 0x7070707);
      uVar1 = (uVar1 >> 8 & 0xf000f) + (uVar1 & 0xf000f);
      *(uint *)&pObj->field_0x8 =
           *(int *)&pObj->field_0x8 + ((uVar1 >> 0x10) + (uVar1 & 0xffff)) * 0x100;
    }
    pObj = pObj + 1;
  } while( true );
switchD_00529d1a_caseD_7:
  iVar2 = iVar2 + 1;
  goto LAB_00529cf5;
}

Assistant:

void Saig_ManSimulateFrames( Saig_SimObj_t * pAig, int nFrames, int nPref )
{
    Saig_SimObj_t * pEntry;
    int f;
    for ( f = 0; f < nFrames; f++ )
    {
        for ( pEntry = pAig; pEntry->Type != AIG_OBJ_VOID; pEntry++ )
        {
            if ( pEntry->Type == AIG_OBJ_AND )
                Saig_ManSimulateNode( pAig, pEntry );
            else if ( pEntry->Type == AIG_OBJ_CO )
                Saig_ManSimulateOneInput( pAig, pEntry );
            else if ( pEntry->Type == AIG_OBJ_CI )
            {
                if ( pEntry->iFan0 == 0 ) // true PI
                    pEntry->pData[0] = Aig_ManRandom( 0 );
                else if ( f > 0 ) // register output
                    Saig_ManSimulateOneInput( pAig, pEntry );
            }
            else if ( pEntry->Type == AIG_OBJ_CONST1 )
                pEntry->pData[0] = ~0;
            else if ( pEntry->Type != AIG_OBJ_NONE )
                assert( 0 );
            if ( f >= nPref )
                pEntry->Number += Aig_WordCountOnes( pEntry->pData[0] );
        }
    }
}